

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFx.c
# Opt level: O3

int Fx_FastExtract(Vec_Wec_t *vCubes,int ObjIdMax,int nNewNodesMax,int LitCountMax,int fCanonDivs,
                  int fVerbose,int fVeryVerbose)

{
  undefined4 *puVar1;
  undefined8 *puVar2;
  Vec_Int_t *pVVar3;
  Vec_Que_t *pVVar4;
  int *piVar5;
  int *piVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  int iVar9;
  int iVar10;
  Fx_Man_t *p;
  void *pvVar11;
  Vec_Wec_t *pVVar12;
  long lVar13;
  uint uVar14;
  abctime aVar15;
  float *extraout_RDX;
  float *fWarning;
  int iVar16;
  uint uVar17;
  long lVar18;
  uint uVar19;
  int iVar20;
  uint uVar21;
  ulong uVar22;
  long lVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  timespec local_58;
  int local_48;
  int local_44;
  long local_40;
  size_t local_38;
  
  local_48 = fVerbose;
  local_44 = nNewNodesMax;
  iVar9 = clock_gettime(3,&local_58);
  if (iVar9 < 0) {
    lVar23 = -1;
  }
  else {
    lVar23 = local_58.tv_nsec / 1000 + local_58.tv_sec * 1000000;
  }
  p = Fx_ManStart(vCubes);
  p->LitCountMax = LitCountMax;
  p->fCanonDivs = fCanonDivs;
  Fx_ManCreateLiterals(p,ObjIdMax);
  Fx_ManComputeLevel(p);
  Fx_ManCreateDivisors(p);
  local_40 = lVar23;
  if ((fVeryVerbose != 0) && (p->vLits->nSize < 0x36)) {
    printf("         ");
    iVar9 = p->vLits->nSize;
    iVar16 = iVar9 / 2;
    if (1 < iVar9) {
      iVar9 = 0x1a;
      if (iVar16 < 0x1a) {
        iVar9 = iVar16;
      }
      iVar20 = 1;
      if (1 < iVar9) {
        iVar20 = iVar9;
      }
      iVar9 = 0x61;
      do {
        putchar(iVar9);
        iVar10 = iVar9 - iVar20;
        iVar9 = iVar9 + 1;
      } while (iVar10 != 0x60);
    }
    putchar(10);
    pvVar11 = calloc((long)(iVar16 + 1),1);
    pVVar12 = p->vCubes;
    if (0 < pVVar12->nSize) {
      local_38 = (size_t)iVar16;
      uVar22 = 0;
      do {
        pVVar3 = pVVar12->pArray;
        if (pVVar3[uVar22].nSize != 0) {
          memset(pvVar11,0x2d,local_38);
          iVar9 = pVVar3[uVar22].nSize;
          if (1 < iVar9) {
            lVar23 = 1;
            do {
              uVar17 = pVVar3[uVar22].pArray[lVar23];
              if ((int)uVar17 < 0) {
                __assert_fail("Lit >= 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                              ,0xf2,"int Abc_Lit2Var(int)");
              }
              if (iVar16 <= (int)(uVar17 >> 1)) {
                __assert_fail("Abc_Lit2Var(Lit) < nObjs",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcFx.c"
                              ,0x20a,"void Fx_PrintMatrix(Fx_Man_t *)");
              }
              *(byte *)((long)pvVar11 + (ulong)(uVar17 >> 1)) = (byte)uVar17 & 1 ^ 0x31;
              lVar23 = lVar23 + 1;
              iVar9 = pVVar3[uVar22].nSize;
            } while (lVar23 < iVar9);
          }
          if (iVar9 < 1) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                          ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          printf("%6d : %s %4d\n",uVar22 & 0xffffffff,pvVar11,(ulong)(uint)*pVVar3[uVar22].pArray);
          pVVar12 = p->vCubes;
        }
        uVar22 = uVar22 + 1;
      } while ((long)uVar22 < (long)pVVar12->nSize);
    }
    if (pvVar11 != (void *)0x0) {
      free(pvVar11);
    }
    pVVar12 = p->vLits;
    if (0 < pVVar12->nSize) {
      uVar22 = 0;
      do {
        pVVar3 = pVVar12->pArray;
        printf("%c : ",(ulong)(uint)(int)(char)(((uVar22 & 1) == 0) * ' ' + (char)(uVar22 >> 1) +
                                               'A'));
        printf("Vector has %d entries: {",(ulong)(uint)pVVar3[uVar22].nSize);
        if (0 < pVVar3[uVar22].nSize) {
          lVar23 = 0;
          do {
            printf(" %d",(ulong)(uint)pVVar3[uVar22].pArray[lVar23]);
            lVar23 = lVar23 + 1;
          } while (lVar23 < pVVar3[uVar22].nSize);
        }
        puts(" }");
        uVar22 = uVar22 + 1;
        pVVar12 = p->vLits;
      } while ((long)uVar22 < (long)pVVar12->nSize);
    }
    lVar23 = local_40;
    if (0 < p->vWeights->nSize) {
      iVar9 = 0;
      do {
        Fx_PrintDiv(p,iVar9);
        iVar9 = iVar9 + 1;
      } while (iVar9 < p->vWeights->nSize);
    }
  }
  iVar9 = local_44;
  if (local_48 != 0) {
    iVar16 = clock_gettime(3,&local_58);
    if (iVar16 < 0) {
      lVar18 = -1;
    }
    else {
      lVar18 = local_58.tv_nsec / 1000 + local_58.tv_sec * 1000000;
    }
    Fx_PrintStats(p,lVar18 - lVar23);
  }
  iVar16 = clock_gettime(3,&local_58);
  if (iVar16 < 0) {
    aVar15 = -1;
  }
  else {
    aVar15 = local_58.tv_nsec / 1000 + local_58.tv_sec * 1000000;
  }
  p->timeStart = aVar15;
  if (0 < iVar9) {
    iVar16 = 0;
    do {
      pVVar4 = p->vPrio;
      if (pVVar4->nSize < 1) {
        __assert_fail("p->nSize > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecQue.h"
                      ,0x88,"int Vec_QueSize(Vec_Que_t *)");
      }
      if (pVVar4->nSize == 1) break;
      piVar5 = pVVar4->pHeap;
      iVar20 = piVar5[1];
      fWarning = *pVVar4->pCostsFlt;
      if (fWarning == (float *)0x0) {
        fVar24 = (float)iVar20;
      }
      else {
        fVar24 = fWarning[iVar20];
      }
      if (fVar24 <= 0.0) break;
      piVar6 = pVVar4->pOrder;
      piVar6[iVar20] = -1;
      iVar10 = pVVar4->nSize;
      pVVar4->nSize = iVar10 + -1;
      if (iVar10 + -1 == 1) {
        piVar5[1] = -1;
      }
      else {
        iVar9 = piVar5[(long)iVar10 + -1];
        piVar5[(long)iVar10 + -1] = -1;
        piVar5[1] = iVar9;
        piVar6[iVar9] = 1;
        if (fWarning == (float *)0x0) {
          fVar24 = (float)iVar9;
        }
        else {
          fVar24 = fWarning[iVar9];
        }
        iVar10 = pVVar4->nSize;
        uVar17 = 1;
        if (2 < iVar10) {
          uVar14 = 2;
          uVar17 = 1;
          do {
            uVar21 = uVar14 | 1;
            uVar19 = uVar14;
            if ((int)uVar21 < iVar10) {
              if (fWarning == (float *)0x0) {
                fVar25 = (float)piVar5[(int)uVar14];
                fVar26 = (float)piVar5[(int)uVar21];
              }
              else {
                fVar25 = fWarning[piVar5[(int)uVar14]];
                fVar26 = fWarning[piVar5[(int)uVar21]];
              }
              if (fVar25 < fVar26) {
                uVar19 = uVar21;
              }
            }
            if (iVar10 <= (int)uVar19) {
              __assert_fail("child < p->nSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecQue.h"
                            ,0xbc,"void Vec_QueMoveDown(Vec_Que_t *, int)");
            }
            iVar10 = piVar5[(int)uVar19];
            if (fWarning == (float *)0x0) {
              fVar25 = (float)iVar10;
            }
            else {
              fVar25 = fWarning[iVar10];
            }
            if (fVar25 <= fVar24) break;
            piVar5[(int)uVar17] = iVar10;
            piVar6[iVar10] = uVar17;
            uVar14 = uVar19 * 2;
            iVar10 = pVVar4->nSize;
            uVar17 = uVar19;
          } while ((int)uVar14 < iVar10);
        }
        piVar5[(int)uVar17] = iVar9;
        piVar6[iVar9] = uVar17;
        iVar9 = local_44;
      }
      if (fVeryVerbose != 0) {
        Fx_PrintDiv(p,iVar20);
        fWarning = extraout_RDX;
      }
      Fx_ManUpdate(p,iVar20,(int *)fWarning);
      iVar16 = iVar16 + 1;
    } while (iVar16 != iVar9);
  }
  if (local_48 != 0) {
    iVar9 = clock_gettime(3,&local_58);
    if (iVar9 < 0) {
      lVar23 = -1;
    }
    else {
      lVar23 = local_58.tv_nsec / 1000 + local_58.tv_sec * 1000000;
    }
    Fx_PrintStats(p,lVar23 - local_40);
  }
  Fx_ManStop(p);
  iVar9 = vCubes->nSize;
  if (iVar9 < 1) {
    uVar17 = 0;
  }
  else {
    lVar23 = 0;
    lVar18 = 8;
    uVar17 = 0;
    do {
      pVVar3 = vCubes->pArray;
      if (*(int *)((long)pVVar3 + lVar18 + -4) < 1) {
        pvVar11 = *(void **)((long)&pVVar3->nCap + lVar18);
        if (pvVar11 != (void *)0x0) {
          free(pvVar11);
          *(undefined8 *)((long)&pVVar3->nCap + lVar18) = 0;
        }
      }
      else {
        puVar1 = (undefined4 *)((long)&pVVar3->nCap + lVar18);
        lVar13 = (long)(int)uVar17;
        uVar17 = uVar17 + 1;
        iVar9 = puVar1[-1];
        uVar7 = *puVar1;
        uVar8 = puVar1[1];
        pVVar3 = pVVar3 + lVar13;
        pVVar3->nCap = puVar1[-2];
        pVVar3->nSize = iVar9;
        *(undefined4 *)&pVVar3->pArray = uVar7;
        *(undefined4 *)((long)&pVVar3->pArray + 4) = uVar8;
      }
      lVar23 = lVar23 + 1;
      iVar9 = vCubes->nSize;
      lVar18 = lVar18 + 0x10;
    } while (lVar23 < iVar9);
    if ((int)uVar17 < iVar9) {
      if ((int)uVar17 < 0) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWec.h"
                      ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      lVar23 = (ulong)uVar17 << 4;
      uVar14 = uVar17;
      do {
        puVar2 = (undefined8 *)((long)&vCubes->pArray->nCap + lVar23);
        *puVar2 = 0;
        puVar2[1] = 0;
        iVar9 = vCubes->nSize;
        uVar14 = uVar14 + 1;
        lVar23 = lVar23 + 0x10;
      } while ((int)uVar14 < iVar9);
    }
  }
  if (iVar9 < (int)uVar17) {
    __assert_fail("p->nSize >= nSizeNew",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWec.h"
                  ,0xfa,"void Vec_WecShrink(Vec_Wec_t *, int)");
  }
  vCubes->nSize = uVar17;
  return 1;
}

Assistant:

int Fx_FastExtract( Vec_Wec_t * vCubes, int ObjIdMax, int nNewNodesMax, int LitCountMax, int fCanonDivs, int fVerbose, int fVeryVerbose )
{
    int fVeryVeryVerbose = 0;
    int i, iDiv, fWarning = 0;
    Fx_Man_t * p;
    abctime clk = Abc_Clock();
    // initialize the data-structure
    p = Fx_ManStart( vCubes );
    p->LitCountMax = LitCountMax;
    p->fCanonDivs = fCanonDivs;
    Fx_ManCreateLiterals( p, ObjIdMax );
    Fx_ManComputeLevel( p );
    Fx_ManCreateDivisors( p );
    if ( fVeryVerbose )
        Fx_PrintMatrix( p );
    if ( fVerbose )
        Fx_PrintStats( p, Abc_Clock() - clk );
    // perform extraction
    p->timeStart = Abc_Clock();
    for ( i = 0; i < nNewNodesMax && Vec_QueTopPriority(p->vPrio) > 0.0; i++ )
    {
        iDiv = Vec_QuePop(p->vPrio);
        if ( fVeryVerbose )
            Fx_PrintDiv( p, iDiv );
        Fx_ManUpdate( p, iDiv, &fWarning );
        if ( fVeryVeryVerbose )
            Fx_PrintMatrix( p );
    }
    if ( fVerbose )
        Fx_PrintStats( p, Abc_Clock() - clk );
    Fx_ManStop( p );
    // return the result
    Vec_WecRemoveEmpty( vCubes );
    return 1;
}